

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsortA.c
# Opt level: O2

void burstsortA(string *strings,size_t scnt)

{
  uint uVar1;
  uint uVar2;
  byte *pbVar3;
  string puVar4;
  TRIE_conflict *node;
  byte *pbVar5;
  char **ppcVar6;
  TRIE_conflict *pTVar7;
  char *pcVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  TRIE_conflict *pTVar15;
  ulong uVar16;
  long lVar17;
  
  node = (TRIE_conflict *)calloc(1,0xd08);
  uVar10 = 0;
  uVar11 = scnt & 0xffffffff;
  if ((int)scnt < 1) {
    uVar11 = uVar10;
  }
  uVar12 = 0;
  do {
    if (uVar10 == uVar11) {
      bursttraverseA(node,strings,0,0);
      return;
    }
    pbVar3 = strings[uVar10];
    bVar13 = 0;
    pbVar5 = pbVar3;
    pTVar15 = node;
    while( true ) {
      bVar9 = *pbVar5;
      uVar16 = (ulong)bVar9;
      uVar1 = pTVar15->counts[uVar16];
      if (-1 < (long)(int)uVar1) break;
      pTVar15 = (TRIE_conflict *)pTVar15->ptrs[uVar16];
      bVar13 = bVar13 + 1;
      pbVar5 = pbVar3 + bVar13;
    }
    if (uVar1 == 0) {
      if (bVar9 == 0) {
        ppcVar6 = (char **)calloc(0x2000,8);
        pTVar15->ptrs[uVar16] = ppcVar6;
        if (ppcVar6 == (char **)0x0) goto LAB_002238d0;
        pTVar15->nulltailptr = ppcVar6;
        *ppcVar6 = (char *)strings[uVar10];
        pTVar15->nulltailptr = pTVar15->nulltailptr + 1;
        pTVar15->counts[uVar16] = 1;
      }
      else {
        ppcVar6 = (char **)calloc(0x10,8);
        pTVar15->ptrs[uVar16] = ppcVar6;
        if (ppcVar6 == (char **)0x0) {
LAB_002238d0:
          puts("Error: Out of memory ");
          exit(1);
        }
        puVar4 = strings[uVar10];
        pTVar15->counts[uVar16] = 1;
        *ppcVar6 = (char *)puVar4;
        pTVar15->levels[uVar16] = pTVar15->levels[uVar16] + '\x01';
      }
    }
    else {
      if (bVar9 == 0) {
        *pTVar15->nulltailptr = (char *)pbVar3;
        ppcVar6 = pTVar15->nulltailptr;
        pTVar15->nulltailptr = ppcVar6 + 1;
        pTVar15->counts[uVar16] = uVar1 + 1;
        if ((uVar1 + 1) % 0x1fff == 0) {
          pcVar8 = (char *)calloc(0x2000,8);
          ppcVar6[1] = pcVar8;
          if (pcVar8 == (char *)0x0) goto LAB_002238d0;
          pTVar15->nulltailptr = (char **)*pTVar15->nulltailptr;
        }
      }
      else {
        ppcVar6 = pTVar15->ptrs[uVar16];
        pTVar15->counts[uVar16] = uVar1 + 1;
        ppcVar6[(int)uVar1] = (char *)pbVar3;
        if ((uVar1 < 0x1fff) && ((int)(bucket_inc[pTVar15->levels[uVar16]] - 1) <= (int)uVar1)) {
          ppcVar6 = pTVar15->ptrs[uVar16];
          bVar9 = pTVar15->levels[uVar16] + 1;
          pTVar15->levels[uVar16] = bVar9;
          ppcVar6 = (char **)realloc(ppcVar6,(ulong)bucket_inc[bVar9] << 3);
          pTVar15->ptrs[uVar16] = ppcVar6;
          if (ppcVar6 == (char **)0x0) goto LAB_002238d0;
        }
      }
      while (((char)uVar16 != '\0' && (uVar1 = pTVar15->counts[uVar16], 0x1fff < (int)uVar1))) {
        pTVar7 = (TRIE_conflict *)calloc(1,0xd08);
        if (pTVar7 == (TRIE_conflict *)0x0) goto LAB_002238d0;
        bVar13 = bVar13 + 1;
        for (uVar14 = 0; uVar1 != uVar14; uVar14 = uVar14 + 1) {
          pcVar8 = pTVar15->ptrs[uVar16][uVar14];
          bVar9 = pcVar8[bVar13];
          uVar12 = (ulong)bVar9;
          uVar2 = pTVar7->counts[uVar12];
          lVar17 = (long)(int)uVar2;
          if (lVar17 < 1) {
            if (bVar9 == 0) {
              ppcVar6 = (char **)calloc(0x2000,8);
              pTVar7->ptrs[uVar12] = ppcVar6;
              if (ppcVar6 == (char **)0x0) goto LAB_002238d0;
              pTVar7->nulltailptr = ppcVar6;
              *ppcVar6 = pTVar15->ptrs[uVar16][uVar14];
              pTVar7->nulltailptr = ppcVar6 + 1;
              pTVar7->counts[uVar12] = uVar2 + 1;
            }
            else {
              ppcVar6 = (char **)calloc(0x10,8);
              pTVar7->ptrs[uVar12] = ppcVar6;
              if (ppcVar6 == (char **)0x0) goto LAB_002238d0;
              pcVar8 = pTVar15->ptrs[uVar16][uVar14];
              pTVar7->counts[uVar12] = uVar2 + 1;
              ppcVar6[lVar17] = pcVar8;
              pTVar7->levels[uVar12] = pTVar7->levels[uVar12] + '\x01';
            }
          }
          else if (bVar9 == 0) {
            *pTVar7->nulltailptr = pcVar8;
            ppcVar6 = pTVar7->nulltailptr;
            pTVar7->nulltailptr = ppcVar6 + 1;
            pTVar7->counts[uVar12] = uVar2 + 1;
            if ((uVar2 + 1) % 0x1fff == 0) {
              pcVar8 = (char *)calloc(0x2000,8);
              ppcVar6[1] = pcVar8;
              if (pcVar8 == (char *)0x0) goto LAB_002238d0;
              pTVar7->nulltailptr = (char **)*pTVar7->nulltailptr;
            }
          }
          else {
            ppcVar6 = pTVar7->ptrs[uVar12];
            pTVar7->counts[uVar12] = uVar2 + 1;
            ppcVar6[lVar17] = pcVar8;
            if ((uVar2 < 0x1fff) && ((int)(bucket_inc[pTVar7->levels[uVar12]] - 1) <= (int)uVar2)) {
              ppcVar6 = pTVar7->ptrs[uVar12];
              bVar9 = pTVar7->levels[uVar12] + 1;
              pTVar7->levels[uVar12] = bVar9;
              ppcVar6 = (char **)realloc(ppcVar6,(ulong)bucket_inc[bVar9] << 3);
              pTVar7->ptrs[uVar12] = ppcVar6;
              if (ppcVar6 == (char **)0x0) goto LAB_002238d0;
            }
          }
        }
        free(pTVar15->ptrs[uVar16]);
        pTVar15->ptrs[uVar16] = (char **)pTVar7;
        pTVar15->counts[uVar16] = -1;
        pTVar15 = pTVar7;
        uVar16 = uVar12;
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void
burstsortA(string strings[], size_t scnt)
{
    TRIE	*root;

    root = (TRIE *) calloc(1, sizeof(TRIE));

    (void) burstinsertA(root, strings, scnt);
    (void) bursttraverseA(root, strings, 0, 0);

    return;
}